

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O1

int ly_in_fd(ly_in *in,int fd)

{
  int iVar1;
  LY_ERR LVar2;
  char *pcVar3;
  char *addr;
  size_t length;
  char *local_30;
  size_t local_28;
  
  if (in == (ly_in *)0x0) {
    pcVar3 = "in";
  }
  else {
    if (in->type == LY_IN_FD) {
      iVar1 = (in->method).fd;
      if (fd == -1) {
        return iVar1;
      }
      LVar2 = ly_mmap((ly_ctx *)0x0,fd,&local_28,&local_30);
      if (LVar2 != LY_SUCCESS) {
        return -1;
      }
      if (local_30 != (char *)0x0) {
        ly_munmap(in->start,in->length);
        (in->method).fd = fd;
        in->start = local_30;
        in->current = local_30;
        in->line = 1;
        in->length = local_28;
        return iVar1;
      }
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Empty input file.");
      return -1;
    }
    pcVar3 = "in->type == LY_IN_FD";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar3,"ly_in_fd");
  return -1;
}

Assistant:

LIBYANG_API_DEF int
ly_in_fd(struct ly_in *in, int fd)
{
    int prev_fd;
    size_t length;
    const char *addr;

    LY_CHECK_ARG_RET(NULL, in, in->type == LY_IN_FD, -1);

    prev_fd = in->method.fd;

    if (fd != -1) {
        LY_CHECK_RET(ly_mmap(NULL, fd, &length, (void **)&addr), -1);
        if (!addr) {
            LOGERR(NULL, LY_EINVAL, "Empty input file.");
            return -1;
        }

        ly_munmap((char *)in->start, in->length);

        in->method.fd = fd;
        in->current = in->start = addr;
        in->line = 1;
        in->length = length;
    }

    return prev_fd;
}